

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdn.cpp
# Opt level: O2

bool __thiscall DSDcc::DSDNXDN::CACLong::decode(CACLong *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  CNXDNConvolution conv;
  CNXDNConvolution CStack_48;
  
  CNXDNConvolution::CNXDNConvolution(&CStack_48);
  CNXDNConvolution::start(&CStack_48);
  for (lVar4 = 0; (int)lVar4 != 0xa0; lVar4 = lVar4 + 1) {
    CNXDNConvolution::decode(&CStack_48,this->m_temp[lVar4 * 2],this->m_temp[lVar4 * 2 + 1]);
  }
  CNXDNConvolution::chainback(&CStack_48,this->m_data,0x9c);
  bVar1 = CNXDNCRC::checkCRC16(this->m_data,0x88);
  pcVar3 = "DSDNXDN::CACLong::decode: bad CRC";
  if (bVar1) {
    pcVar3 = "DSDNXDN::CACLong::decode: CRC OK";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  CNXDNConvolution::~CNXDNConvolution(&CStack_48);
  return bVar1;
}

Assistant:

bool DSDNXDN::CACLong::decode()
{
    CNXDNConvolution conv;
    conv.start();
    int n = 0;

    for (unsigned int i = 0U; i < 160U; i++)
    {
        uint8_t s0 = m_temp[n++];
        uint8_t s1 = m_temp[n++];

        conv.decode(s0, s1);
    }

    conv.chainback(m_data, 156U);

    if (!CNXDNCRC::checkCRC16(m_data, 136))
    {
        std::cerr << "DSDNXDN::CACLong::decode: bad CRC" << std::endl;
        return false;
    }
    else
    {
        std::cerr << "DSDNXDN::CACLong::decode: CRC OK" << std::endl;
        return true;
    }
}